

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rva.inc.c
# Opt level: O0

_Bool trans_sc_w(DisasContext_conflict12 *ctx,arg_sc_w *a)

{
  _Bool _Var1;
  arg_sc_w *a_local;
  DisasContext_conflict12 *ctx_local;
  
  _Var1 = has_ext(ctx,1);
  if (_Var1) {
    ctx_local._7_1_ = gen_sc(ctx,a,MO_ALIGN|MO_LESL);
  }
  else {
    ctx_local._7_1_ = false;
  }
  return ctx_local._7_1_;
}

Assistant:

static bool trans_sc_w(DisasContext *ctx, arg_sc_w *a)
{
    REQUIRE_EXT(ctx, RVA);
    return gen_sc(ctx, a, (MO_ALIGN | MO_TESL));
}